

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O2

string * __thiscall
MinVR::VRDisplayNode::getName_abi_cxx11_(string *__return_storage_ptr__,VRDisplayNode *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getName() const { return _name; }